

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * GetCandidates(string *__return_storage_ptr__,TSpellCorrector *corrector,string *text)

{
  json_value *this;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  pointer *text_00;
  value_t vVar1;
  json_value jVar2;
  json_value jVar3;
  undefined1 auVar4 [8];
  string *psVar5;
  wint_t wVar6;
  int iVar7;
  TLangModel *this_01;
  reference pvVar8;
  wchar_t *pwVar9;
  ulong uVar10;
  size_t position;
  ulong uVar11;
  long lVar12;
  undefined1 local_188 [8];
  wstring input;
  string candidateStr;
  json_value local_140;
  size_t local_138;
  ulong local_130;
  string *local_128;
  size_type *local_120;
  wstring wCurrWord;
  wstring firstCandidate;
  TSentences sentences;
  json_value local_c0 [8];
  undefined1 local_b8 [24];
  TWords candidates;
  undefined1 local_80 [8];
  json results;
  json_value local_68;
  undefined1 local_60 [8];
  json currentResult;
  json_value local_48;
  undefined1 local_40 [8];
  json_value local_38;
  
  NJamSpell::UTF8ToWide((wstring *)local_188,text);
  auVar4 = local_188;
  if (input._M_dataplus._M_p != (pointer)0x0) {
    lVar12 = 0;
    do {
      wVar6 = towlower(*(wint_t *)((long)auVar4 + lVar12));
      *(wint_t *)((long)auVar4 + lVar12) = wVar6;
      lVar12 = lVar12 + 4;
    } while ((long)input._M_dataplus._M_p << 2 != lVar12);
  }
  this_01 = NJamSpell::TSpellCorrector::GetLangModel(corrector);
  NJamSpell::TLangModel::Tokenize
            ((TSentences *)((long)&firstCandidate.field_2 + 8),this_01,(wstring *)local_188);
  local_80[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 )0x0;
  results.m_type = null;
  results._1_7_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_80);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_80);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)((long)&candidateStr.field_2 + 8),(initializer_list_t)ZEXT816(0),false,array);
  local_128 = __return_storage_ptr__;
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_80,"results");
  this_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)((long)&candidateStr.field_2 + 8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(this_00);
  vVar1 = pvVar8->m_type;
  pvVar8->m_type = candidateStr.field_2._M_local_buf[8];
  jVar2 = pvVar8->m_value;
  pvVar8->m_value = local_140;
  candidateStr.field_2._M_local_buf[8] = vVar1;
  local_140 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(pvVar8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(this_00);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&stack0xfffffffffffffec0,candidateStr.field_2._M_local_buf[8])
  ;
  if (sentences.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)firstCandidate.field_2._8_8_) {
    uVar11 = 0;
    text_00 = &sentences.
               super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      pwVar9 = *(wchar_t **)(firstCandidate.field_2._8_8_ + uVar11 * 0x18);
      local_130 = uVar11;
      if (*(wchar_t **)(firstCandidate.field_2._8_8_ + 8 + uVar11 * 0x18) != pwVar9) {
        candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(firstCandidate.field_2._8_8_ + uVar11 * 0x18);
        position = 0;
        do {
          lVar12 = *(long *)(pwVar9 + position * 4);
          jVar2 = (json_value)((json_value *)(pwVar9 + position * 4 + 2))->number_integer;
          local_120 = &wCurrWord._M_string_length;
          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                    ((wstring *)&local_120,lVar12,lVar12 + jVar2.number_integer * 4);
          NJamSpell::TSpellCorrector::GetCandidatesRaw
                    ((TWords *)(local_b8 + 0x10),corrector,
                     (TWords *)
                     candidates.
                     super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage,position);
          if ((pointer)local_b8._16_8_ !=
              candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            wCurrWord.field_2._8_8_ = &firstCandidate._M_string_length;
            std::__cxx11::wstring::_M_construct<wchar_t_const*>
                      ((wstring *)((long)&wCurrWord.field_2 + 8),*(wchar_t **)local_b8._16_8_,
                       *(wchar_t **)local_b8._16_8_ + *(size_t *)(local_b8._16_8_ + 8));
            if (wCurrWord._M_dataplus._M_p == firstCandidate._M_dataplus._M_p) {
              if (wCurrWord._M_dataplus._M_p != (pointer)0x0) {
                iVar7 = wmemcmp((wchar_t *)local_120,(wchar_t *)wCurrWord.field_2._8_8_,
                                (size_t)wCurrWord._M_dataplus._M_p);
                if (iVar7 != 0) goto LAB_0012d4d5;
              }
            }
            else {
LAB_0012d4d5:
              local_60[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             )0x0;
              currentResult.m_type = null;
              currentResult._1_7_ = 0;
              local_138 = position;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_60);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_60);
              local_48.number_integer = lVar12 - (long)local_188 >> 2;
              currentResult.m_value.boolean = true;
              this = &currentResult.m_value;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)this);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)this);
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_60,"pos_from");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)this);
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = currentResult.m_value.boolean;
              jVar3 = pvVar8->m_value;
              (pvVar8->m_value).number_integer = (number_integer_t)local_48;
              currentResult.m_value.boolean = (boolean_t)vVar1;
              local_48 = jVar3;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant(pvVar8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)this);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_48.boolean,currentResult.m_value.boolean);
              local_40[0] = number_unsigned;
              local_38 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_40);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_40);
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_60,"len");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_40);
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = local_40[0];
              jVar2 = pvVar8->m_value;
              (pvVar8->m_value).number_integer = (number_integer_t)local_38;
              local_40[0] = vVar1;
              local_38 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant(pvVar8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_40);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)(local_40 + 8),local_40[0]);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)&results.m_value,(initializer_list_t)ZEXT816(0),false,array);
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_60,"candidates");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)&results.m_value);
              vVar1 = pvVar8->m_type;
              pvVar8->m_type = results.m_value.boolean;
              jVar2 = pvVar8->m_value;
              pvVar8->m_value = local_68;
              results.m_value.boolean = (boolean_t)vVar1;
              local_68 = jVar2;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant(pvVar8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)&results.m_value);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&local_68.boolean,results.m_value.boolean);
              position = local_138;
              if ((long)candidates.
                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                        _M_impl.super__Vector_impl_data._M_start - local_b8._16_8_ != 0) {
                uVar11 = (long)candidates.
                               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                               ._M_impl.super__Vector_impl_data._M_start - local_b8._16_8_ >> 4;
                if (6 < uVar11) {
                  uVar11 = 7;
                }
                uVar10 = 0;
                do {
                  lVar12 = *(long *)((long)(wchar_t **)local_b8._16_8_ + uVar10);
                  sentences.
                  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8;
                  std::__cxx11::wstring::_M_construct<wchar_t_const*>
                            ((wstring *)text_00,lVar12,
                             lVar12 + *(long *)((long)(local_b8._16_8_ + 8) + uVar10) * 4);
                  NJamSpell::WideToUTF8((string *)((long)&input.field_2 + 8),(wstring *)text_00);
                  if (sentences.
                      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_b8) {
                    operator_delete(sentences.
                                    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  pvVar8 = nlohmann::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                       *)local_60,"candidates");
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::
                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)text_00,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&input.field_2 + 8));
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::push_back(pvVar8,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                      *)text_00);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                      *)text_00);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::json_value::destroy
                            (local_c0,(value_t)sentences.
                                               super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if ((size_type *)input.field_2._8_8_ != &candidateStr._M_string_length) {
                    operator_delete((void *)input.field_2._8_8_);
                  }
                  uVar10 = uVar10 + 0x10;
                } while (((int)uVar11 + (uint)(uVar11 == 0)) * 0x10 != uVar10);
              }
              pvVar8 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)local_80,"results");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::push_back(pvVar8,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_60);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_60);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::json_value::destroy((json_value *)&currentResult,(value_t)local_60[0]);
            }
            if ((size_type *)wCurrWord.field_2._8_8_ != &firstCandidate._M_string_length) {
              operator_delete((void *)wCurrWord.field_2._8_8_);
            }
          }
          if ((pointer)local_b8._16_8_ != (pointer)0x0) {
            operator_delete((void *)local_b8._16_8_);
          }
          if (local_120 != &wCurrWord._M_string_length) {
            operator_delete(local_120);
          }
          position = position + 1;
          pwVar9 = (candidates.
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage)->Ptr;
        } while (position <
                 (ulong)((long)((candidates.
                                 super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->Len -
                               (long)pwVar9) >> 4));
      }
      uVar11 = local_130 + 1;
    } while (uVar11 < (ulong)(((long)sentences.
                                     super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start -
                               firstCandidate.field_2._8_8_ >> 3) * -0x5555555555555555));
  }
  psVar5 = local_128;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(local_128,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)local_80,4,' ',false);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_80);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&results,(value_t)local_80[0]);
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)((long)&firstCandidate.field_2 + 8));
  if (local_188 != (undefined1  [8])&input._M_string_length) {
    operator_delete((void *)local_188);
  }
  return psVar5;
}

Assistant:

std::string GetCandidates(const NJamSpell::TSpellCorrector& corrector,
                          const std::string& text)
{
    std::wstring input = NJamSpell::UTF8ToWide(text);
    std::transform(input.begin(), input.end(), input.begin(), std::towlower);
    NJamSpell::TSentences sentences = corrector.GetLangModel().Tokenize(input);

    nlohmann::json results;
    results["results"] = nlohmann::json::array();

    for (size_t i = 0; i < sentences.size(); ++i) {
        const NJamSpell::TWords& sentence = sentences[i];
        for (size_t j = 0; j < sentence.size(); ++j) {
            NJamSpell::TWord currWord = sentence[j];
            std::wstring wCurrWord(currWord.Ptr, currWord.Len);
            NJamSpell::TWords candidates = corrector.GetCandidatesRaw(sentence, j);
            if (candidates.empty()) {
                continue;
            }
            std::wstring firstCandidate(candidates[0].Ptr, candidates[0].Len);
            if (wCurrWord == firstCandidate) {
                continue;
            }
            nlohmann::json currentResult;
            currentResult["pos_from"] = currWord.Ptr - &input[0];
            currentResult["len"] = currWord.Len;
            currentResult["candidates"] = nlohmann::json::array();

            size_t candidatesSize = std::min(candidates.size(), size_t(7));
            for (size_t k = 0; k < candidatesSize; ++k) {
                NJamSpell::TWord candidate = candidates[k];
                std::string candidateStr = NJamSpell::WideToUTF8(std::wstring(candidate.Ptr, candidate.Len));
                currentResult["candidates"].push_back(candidateStr);
            }

            results["results"].push_back(currentResult);
        }
    }

    return results.dump(4);
}